

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

int32_t difference_vector16(uint16_t *A,size_t s_a,uint16_t *B,size_t s_b,uint16_t *C)

{
  ushort uVar1;
  ushort uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 (*pauVar5) [16];
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  undefined1 in_ZMM0 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  uint16_t buffer [8];
  undefined1 local_48 [16];
  
  if (s_a == 0) {
    return 0;
  }
  if (s_b == 0) {
    if (A != C) {
      memcpy(C,A,s_a * 2);
    }
    return (int32_t)s_a;
  }
  if (*A == 0) {
    if (*B == 0) {
      A = A + 1;
      s_a = s_a - 1;
      B = B + 1;
      s_b = s_b - 1;
      iVar10 = 0;
    }
    else {
      *C = 0;
      A = A + 1;
      s_a = s_a - 1;
      iVar10 = 1;
    }
  }
  else {
    iVar10 = 0;
    if (*B == 0) {
      B = B + 1;
      s_b = s_b - 1;
    }
  }
  uVar13 = s_a & 0xfffffffffffffff8;
  uVar11 = s_b & 0xfffffffffffffff8;
  if (uVar11 == 0 || uVar13 == 0) {
    uVar12 = 0;
    uVar14 = 0;
  }
  else {
    auVar3 = vlddqu_avx(*(undefined1 (*) [16])A);
    auVar16 = ZEXT1664(auVar3);
    auVar17 = ZEXT1664((undefined1  [16])0x0);
    uVar8 = 0;
    uVar12 = 0;
    pauVar5 = (undefined1 (*) [16])B;
    while( true ) {
      auVar3 = vlddqu_avx(*pauVar5);
      uVar2 = *(ushort *)(*(undefined1 (*) [16])B + uVar12 * 2 + 0xe);
      uVar7 = uVar8;
      do {
        vpcmpistrm_avx(auVar3,auVar16._0_16_,1);
        auVar4 = vpor_avx(auVar17._0_16_,in_ZMM0._0_16_);
        auVar17 = ZEXT1664(auVar4);
        uVar1 = *(ushort *)(*(undefined1 (*) [16])A + uVar7 * 2 + 0xe);
        uVar8 = uVar7;
        if (uVar1 <= uVar2) {
          uVar8 = uVar7 + 8;
          uVar9 = auVar4._0_4_ ^ 0xff;
          auVar4 = vpshufb_avx(auVar16._0_16_,
                               *(undefined1 (*) [16])(shuffle_mask16 + (long)(int)uVar9 * 0x10));
          in_ZMM0 = ZEXT1664(auVar4);
          *(undefined1 (*) [16])(C + iVar10) = auVar4;
          iVar10 = iVar10 + POPCOUNT(uVar9);
          uVar14 = uVar13;
          if (uVar8 == uVar13) goto LAB_00101b4f;
          auVar4 = vlddqu_avx(*(undefined1 (*) [16])
                               (*(undefined1 (*) [16])((long)A + 0x10) + uVar7 * 2));
          auVar16 = ZEXT1664(auVar4);
          auVar17 = ZEXT1664((undefined1  [16])0x0);
        }
        uVar7 = uVar8;
      } while (uVar1 < uVar2);
      if (uVar12 + 8 == uVar11) break;
      pauVar5 = (undefined1 (*) [16])(*(undefined1 (*) [16])((long)B + 0x10) + uVar12 * 2);
      uVar12 = uVar12 + 8;
    }
    uVar12 = uVar11;
    uVar14 = uVar8;
    if (uVar8 < uVar13) {
      local_48 = (undefined1  [16])0x0;
      memcpy(local_48,*(undefined1 (*) [16])B + uVar11 * 2,(ulong)((int)s_b * 2 & 0xe));
      auVar3 = vlddqu_avx(local_48);
      vpcmpistrm_avx(auVar3,auVar16._0_16_,1);
      auVar3 = vpor_avx(auVar3,auVar17._0_16_);
      uVar9 = auVar3._0_4_ ^ 0xff;
      auVar3 = vpshufb_avx(auVar16._0_16_,
                           *(undefined1 (*) [16])(shuffle_mask16 + (long)(int)uVar9 * 0x10));
      *(undefined1 (*) [16])(C + iVar10) = auVar3;
      iVar10 = iVar10 + POPCOUNT(uVar9);
      uVar14 = uVar8 + 8;
    }
  }
LAB_00101b4f:
  bVar15 = uVar14 < s_a;
  if (uVar12 < s_b && bVar15) {
    do {
      uVar2 = *(ushort *)(*(undefined1 (*) [16])A + uVar14 * 2);
      if (*(ushort *)(*(undefined1 (*) [16])B + uVar12 * 2) < uVar2) {
LAB_00101b89:
        uVar12 = uVar12 + 1;
      }
      else {
        if (*(ushort *)(*(undefined1 (*) [16])B + uVar12 * 2) <= uVar2) {
          uVar14 = uVar14 + 1;
          goto LAB_00101b89;
        }
        C[iVar10] = uVar2;
        iVar10 = iVar10 + 1;
        uVar14 = uVar14 + 1;
      }
      bVar15 = uVar14 < s_a;
    } while ((bVar15) && (uVar12 < s_b));
  }
  if (!bVar15) {
    return iVar10;
  }
  if (A == C) {
    if (uVar14 <= (ulong)(long)iVar10) goto LAB_00101bd5;
    lVar6 = s_a - uVar14;
  }
  else {
    lVar6 = s_a - uVar14;
    if (lVar6 == 0) goto LAB_00101bd5;
  }
  memcpy(C + iVar10,*(undefined1 (*) [16])A + uVar14 * 2,lVar6 * 2);
LAB_00101bd5:
  return iVar10 + ((int)s_a - (int)uVar14);
}

Assistant:

int32_t difference_vector16(const uint16_t *__restrict__ A, size_t s_a,
                            const uint16_t *__restrict__ B, size_t s_b,
                            uint16_t *C) {
    // we handle the degenerate case
    if (s_a == 0) return 0;
    if (s_b == 0) {
        if (A != C) memcpy(C, A, sizeof(uint16_t) * s_a);
        return (int32_t)s_a;
    }
    // handle the leading zeroes, it is messy but it allows us to use the fast
    // _mm_cmpistrm instrinsic safely
    int32_t count = 0;
    if ((A[0] == 0) || (B[0] == 0)) {
        if ((A[0] == 0) && (B[0] == 0)) {
            A++;
            s_a--;
            B++;
            s_b--;
        } else if (A[0] == 0) {
            C[count++] = 0;
            A++;
            s_a--;
        } else {
            B++;
            s_b--;
        }
    }
    // at this point, we have two non-empty arrays, made of non-zero
    // increasing values.
    size_t i_a = 0, i_b = 0;
    const size_t vectorlength = sizeof(__m128i) / sizeof(uint16_t);
    const size_t st_a = (s_a / vectorlength) * vectorlength;
    const size_t st_b = (s_b / vectorlength) * vectorlength;
    if ((i_a < st_a) && (i_b < st_b)) {  // this is the vectorized code path
        __m128i v_a, v_b;                //, v_bmax;
        // we load a vector from A and a vector from B
        v_a = _mm_lddqu_si128((__m128i *)&A[i_a]);
        v_b = _mm_lddqu_si128((__m128i *)&B[i_b]);
        // we have a runningmask which indicates which values from A have been
        // spotted in B, these don't get written out.
        __m128i runningmask_a_found_in_b = _mm_setzero_si128();
        /****
         * start of the main vectorized loop
         *****/
        while (true) {
            // afoundinb will contain a mask indicate for each entry in A
            // whether it is seen
            // in B
            const __m128i a_found_in_b = _mm_cmpistrm(
                v_b, v_a,
                _SIDD_UWORD_OPS | _SIDD_CMP_EQUAL_ANY | _SIDD_BIT_MASK);
            runningmask_a_found_in_b =
                _mm_or_si128(runningmask_a_found_in_b, a_found_in_b);
            // we always compare the last values of A and B
            const uint16_t a_max = A[i_a + vectorlength - 1];
            const uint16_t b_max = B[i_b + vectorlength - 1];
            if (a_max <= b_max) {
                // Ok. In this code path, we are ready to write our v_a
                // because there is no need to read more from B, they will
                // all be large values.
                const int bitmask_belongs_to_difference =
                    _mm_extract_epi32(runningmask_a_found_in_b, 0) ^ 0xFF;
                /*** next few lines are probably expensive *****/
                __m128i sm16 = _mm_loadu_si128((const __m128i *)shuffle_mask16 +
                                               bitmask_belongs_to_difference);
                __m128i p = _mm_shuffle_epi8(v_a, sm16);
                _mm_storeu_si128((__m128i *)&C[count], p);  // can overflow
                count += _mm_popcnt_u32(bitmask_belongs_to_difference);
                // we advance a
                i_a += vectorlength;
                if (i_a == st_a)  // no more
                    break;
                runningmask_a_found_in_b = _mm_setzero_si128();
                v_a = _mm_lddqu_si128((__m128i *)&A[i_a]);
            }
            if (b_max <= a_max) {
                // in this code path, the current v_b has become useless
                i_b += vectorlength;
                if (i_b == st_b) break;
                v_b = _mm_lddqu_si128((__m128i *)&B[i_b]);
            }
        }
        // at this point, either we have i_a == st_a, which is the end of the
        // vectorized processing,
        // or we have i_b == st_b,  and we are not done processing the vector...
        // so we need to finish it off.
        if (i_a < st_a) {        // we have unfinished business...
            uint16_t buffer[8];  // buffer to do a masked load
            memset(buffer, 0, 8 * sizeof(uint16_t));
            memcpy(buffer, B + i_b, (s_b - i_b) * sizeof(uint16_t));
            v_b = _mm_lddqu_si128((__m128i *)buffer);
            const __m128i a_found_in_b = _mm_cmpistrm(
                v_b, v_a,
                _SIDD_UWORD_OPS | _SIDD_CMP_EQUAL_ANY | _SIDD_BIT_MASK);
            runningmask_a_found_in_b =
                _mm_or_si128(runningmask_a_found_in_b, a_found_in_b);
            const int bitmask_belongs_to_difference =
                _mm_extract_epi32(runningmask_a_found_in_b, 0) ^ 0xFF;
            __m128i sm16 = _mm_loadu_si128((const __m128i *)shuffle_mask16 +
                                           bitmask_belongs_to_difference);
            __m128i p = _mm_shuffle_epi8(v_a, sm16);
            _mm_storeu_si128((__m128i *)&C[count], p);  // can overflow
            count += _mm_popcnt_u32(bitmask_belongs_to_difference);
            i_a += vectorlength;
        }
        // at this point we should have i_a == st_a and i_b == st_b
    }
    // do the tail using scalar code
    while (i_a < s_a && i_b < s_b) {
        uint16_t a = A[i_a];
        uint16_t b = B[i_b];
        if (b < a) {
            i_b++;
        } else if (a < b) {
            C[count] = a;
            count++;
            i_a++;
        } else {  //==
            i_a++;
            i_b++;
        }
    }
    if (i_a < s_a) {
        if (C == A) {
            assert((size_t)count <= i_a);
            if ((size_t)count < i_a) {
                memmove(C + count, A + i_a, sizeof(uint16_t) * (s_a - i_a));
            }
        } else {
            for (size_t i = 0; i < (s_a - i_a); i++) {
                C[count + i] = A[i + i_a];
            }
        }
        count += (int32_t)(s_a - i_a);
    }
    return count;
}